

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_timestamp_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,int64_t value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  int result;
  int64_t value_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x38));
  if (((((iVar1 == 0) &&
        (iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x30)), iVar1 == 0)) &&
       (iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x28)), iVar1 == 0)) &&
      ((iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x20)), iVar1 == 0 &&
       (iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x18)), iVar1 == 0)))) &&
     ((iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x10)), iVar1 == 0 &&
      ((iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 8)), iVar1 == 0 &&
       (iVar1 = output_byte(encoder_output,context,(uchar)value), iVar1 == 0)))))) {
    return 0;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
              ,"encode_timestamp_value",0xce6,1,"Failed encoding timestamp value");
  }
  return 0xce7;
}

Assistant:

static int encode_timestamp_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, int64_t value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_295: [<encoding name="ms64" code="0x83" category="fixed" width="8" label="64-bit two's-complement integer representing milliseconds since the unix epoch"/>] */
    if ((output_byte(encoder_output, context, (value >> 56) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value >> 48) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value >> 40) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value >> 32) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value >> 24) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value >> 16) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value >> 8) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, value & 0xFF) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding timestamp value");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}